

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedQueue.h
# Opt level: O0

Buffer * __thiscall
SynchronizedQueue<Buffer>::get(Buffer *__return_storage_ptr__,SynchronizedQueue<Buffer> *this)

{
  size_type sVar1;
  reference pvVar2;
  SynchronizedQueue<Buffer> *this_local;
  Buffer *value;
  
  Buffer::Buffer(__return_storage_ptr__);
  Monitor::enter(&this->super_Monitor);
  sVar1 = std::queue<Buffer,_std::deque<Buffer,_std::allocator<Buffer>_>_>::size(&this->values);
  if (sVar1 == 0) {
    Monitor::wait(&this->super_Monitor,&this->isEmpty);
  }
  pvVar2 = std::queue<Buffer,_std::deque<Buffer,_std::allocator<Buffer>_>_>::front(&this->values);
  Buffer::operator=(__return_storage_ptr__,pvVar2);
  std::queue<Buffer,_std::deque<Buffer,_std::allocator<Buffer>_>_>::pop(&this->values);
  Monitor::leave(&this->super_Monitor);
  return __return_storage_ptr__;
}

Assistant:

T SynchronizedQueue<T>::get() {
    T value;
    enter();
    if (values.size() == 0)
        Monitor::wait(isEmpty);
    value = values.front();
    values.pop();
    leave();
    return value;
}